

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void aom_h_predictor_32x32_avx2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 (*in_RCX) [32];
  __m256i v;
  __m256i u;
  __m256i left_col;
  ptrdiff_t stride_00;
  uint8_t *dst_00;
  __m256i *row;
  
  stride_00 = *(ptrdiff_t *)*in_RCX;
  dst_00 = *(uint8_t **)(*in_RCX + 8);
  row = *(__m256i **)(*in_RCX + 0x10);
  auVar3 = *in_RCX;
  auVar2 = *in_RCX;
  auVar1 = vpunpcklbw_avx2(*in_RCX,*in_RCX);
  vpunpcklbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(row,dst_00,stride_00);
  vpunpckhbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(row,dst_00,stride_00);
  auVar1 = vpunpckhbw_avx2(auVar2,auVar3);
  vpunpcklbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(row,dst_00,stride_00);
  vpunpckhbw_avx2(auVar1,auVar1);
  h_predictor_32x8line(row,dst_00,stride_00);
  return;
}

Assistant:

void aom_h_predictor_32x32_avx2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m256i left_col = _mm256_loadu_si256((__m256i const *)left);

  __m256i u = _mm256_unpacklo_epi8(left_col, left_col);

  __m256i v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  u = _mm256_unpackhi_epi8(left_col, left_col);

  v = _mm256_unpacklo_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
  dst += stride << 2;

  v = _mm256_unpackhi_epi8(u, u);
  h_predictor_32x8line(&v, dst, stride);
}